

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O3

void pfx_table_for_each_rec(trie_node *n,pfx_for_each_fp fp,void *data)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  pfx_record pfxr;
  pfx_record local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (n == (trie_node *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20b,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  if (fp == (pfx_for_each_fp)0x0) {
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20c,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  puVar1 = (uint *)n->data;
  if (puVar1 == (uint *)0x0) {
    __assert_fail("nd",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20f,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  if (n->lchild != (trie_node *)0x0) {
    pfx_table_for_each_rec(n->lchild,fp,data);
  }
  if (*puVar1 != 0) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      lVar2 = *(long *)(puVar1 + 2);
      local_60.asn = *(uint32_t *)(lVar2 + -8 + lVar4);
      local_60.prefix.u.addr6.addr[3] = (n->prefix).u.addr6.addr[3];
      local_60.prefix.ver = (n->prefix).ver;
      local_60.prefix.u.addr4.addr = (lrtr_ipv4_addr)(n->prefix).u.addr4.addr;
      local_60.prefix.u.addr6.addr[1] = (n->prefix).u.addr6.addr[1];
      local_60.prefix.u.addr6.addr[2] = (n->prefix).u.addr6.addr[2];
      local_60.min_len = n->len;
      local_60.max_len = *(uint8_t *)(lVar2 + -4 + lVar4);
      local_60.socket = *(rtr_socket **)(lVar2 + lVar4);
      (*fp)(&local_60,data);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar3 < *puVar1);
  }
  if (n->rchild != (trie_node *)0x0) {
    pfx_table_for_each_rec(n->rchild,fp,data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void pfx_table_for_each_rec(struct trie_node *n, pfx_for_each_fp fp, void *data)
{
	struct pfx_record pfxr;
	struct node_data *nd;

	assert(n);
	assert(fp);

	nd = (struct node_data *)n->data;
	assert(nd);

	if (n->lchild)
		pfx_table_for_each_rec(n->lchild, fp, data);

	for (unsigned int i = 0; i < nd->len; i++) {
		pfxr.asn = nd->ary[i].asn;
		pfxr.prefix = n->prefix;
		pfxr.min_len = n->len;
		pfxr.max_len = nd->ary[i].max_len;
		pfxr.socket = nd->ary[i].socket;
		fp(&pfxr, data);
	}

	if (n->rchild)
		pfx_table_for_each_rec(n->rchild, fp, data);
}